

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

bool __thiscall wasm::WATParser::anon_unknown_11::ParseInput::takeUntilParen(ParseInput *this)

{
  bool bVar1;
  Token *pTVar2;
  undefined1 local_60 [8];
  optional<wasm::WATParser::Token> t;
  ParseInput *this_local;
  
  t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::Token>._64_8_ = this;
  do {
    peek((optional<wasm::WATParser::Token> *)local_60,this);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_60);
    if (bVar1) {
      pTVar2 = std::optional<wasm::WATParser::Token>::operator->
                         ((optional<wasm::WATParser::Token> *)local_60);
      bVar1 = Token::isLParen(pTVar2);
      if (!bVar1) {
        pTVar2 = std::optional<wasm::WATParser::Token>::operator->
                           ((optional<wasm::WATParser::Token> *)local_60);
        bVar1 = Token::isRParen(pTVar2);
        if (!bVar1) {
          Lexer::operator++(&this->lexer);
          bVar1 = false;
          goto LAB_01d31cb9;
        }
      }
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
LAB_01d31cb9:
    std::optional<wasm::WATParser::Token>::~optional((optional<wasm::WATParser::Token> *)local_60);
    if (bVar1) {
      return (bool)(this_local._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool takeUntilParen() {
    while (true) {
      auto t = peek();
      if (!t) {
        return false;
      }
      if (t->isLParen() || t->isRParen()) {
        return true;
      }
      ++lexer;
    }
  }